

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshCListBlock(Parser *this,uint iNumVertices,Mesh *mesh)

{
  pointer paVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint iIndex;
  int local_50;
  uint local_4c;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_48 = &mesh->mVertexColors;
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
            (local_48,(ulong)iNumVertices);
  pbVar6 = (byte *)this->filePtr;
  local_50 = 0;
  do {
    bVar2 = *pbVar6;
    if (bVar2 == 0x2a) {
      while( true ) {
        pbVar5 = pbVar6 + 1;
        this->filePtr = (char *)pbVar5;
        iVar4 = strncmp("MESH_VERTCOL",(char *)pbVar5,0xc);
        if (iVar4 != 0) break;
        bVar2 = pbVar6[0xd];
        if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) break;
        pbVar5 = pbVar6 + 0xe;
        if (bVar2 == 0) {
          pbVar5 = pbVar6 + 0xd;
        }
        this->filePtr = (char *)pbVar5;
        uStack_38 = 0x3f80000000000000;
        local_40 = 0;
        ParseLV4MeshFloatTriple(this,(ai_real *)&local_40,&local_4c);
        if (local_4c < iNumVertices) {
          paVar1 = (local_48->
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
                   .super__Vector_impl_data._M_start + local_4c;
          paVar1->r = (float)(undefined4)local_40;
          paVar1->g = (float)local_40._4_4_;
          paVar1->b = (float)(undefined4)uStack_38;
          paVar1->a = (float)uStack_38._4_4_;
        }
        else {
          LogWarning(this,"Vertex color has an invalid index. It will be ignored");
        }
        pbVar6 = (byte *)this->filePtr;
        pbVar5 = pbVar6;
        if (*pbVar6 != 0x2a) break;
      }
      pbVar6 = pbVar5;
      bVar2 = *pbVar6;
    }
    bVar3 = false;
    if (bVar2 < 0x7b) {
      if ((bVar2 - 0xc < 2) || (bVar2 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_003dfe87;
        this->iLineNumber = this->iLineNumber + 1;
        bVar3 = true;
      }
      else if (bVar2 == 0) {
        LogError(this,
                 "Encountered unexpected EOL while parsing a *MESH_CVERTEX_LIST chunk (Level 3)");
      }
    }
    else {
      if (bVar2 == 0x7d) {
        local_50 = local_50 + -1;
        if (local_50 == 0) {
          this->filePtr = (char *)(pbVar6 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else {
        if (bVar2 != 0x7b) goto LAB_003dfe89;
        local_50 = local_50 + 1;
      }
LAB_003dfe87:
      bVar3 = false;
    }
LAB_003dfe89:
    this->bLastWasEndLine = bVar3;
    pbVar6 = pbVar6 + 1;
    this->filePtr = (char *)pbVar6;
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshCListBlock(unsigned int iNumVertices, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    // allocate enough storage in the array
    mesh.mVertexColors.resize(iNumVertices);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Vertex entry
            if (TokenMatch(filePtr,"MESH_VERTCOL" ,12))
            {
                aiColor4D vTemp;
                vTemp.a = 1.0f;
                unsigned int iIndex;
                ParseLV4MeshFloatTriple(&vTemp.r,iIndex);

                if (iIndex >= iNumVertices)
                {
                    LogWarning("Vertex color has an invalid index. It will be ignored");
                }
                else mesh.mVertexColors[iIndex] = vTemp;
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_CVERTEX_LIST");
    }
    return;
}